

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxFindPath_rec(Str_Mux_t *pMux,int *pPath,int *pnLength)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  iVar4 = pMux->Edge[0].FanDel;
  iVar1 = pMux->Edge[1].FanDel;
  iVar2 = pMux->Edge[2].FanDel;
  iVar3 = iVar2;
  if (iVar2 < iVar1) {
    iVar3 = iVar1;
  }
  uVar5 = 0;
  iVar7 = iVar3;
  if (iVar3 < iVar4) {
    iVar7 = iVar4;
  }
  if ((iVar4 < iVar3) && (uVar5 = 1, iVar1 != iVar7)) {
    if (iVar2 != iVar7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0x657,"int Str_MuxFindPath_rec(Str_Mux_t *, int *, int *)");
    }
    return 0;
  }
  lVar6 = (long)pMux->Edge[(int)uVar5].Fan;
  if ((0 < lVar6) &&
     (iVar4 = Str_MuxFindPath_rec(pMux + (lVar6 - pMux->Id),pPath,pnLength), iVar4 == 0)) {
    return 0;
  }
  if ((uVar5 < 2) && (iVar4 = pMux->Id, -1 < iVar4)) {
    iVar1 = *pnLength;
    *pnLength = iVar1 + 1;
    pPath[iVar1] = uVar5 + iVar4 * 2;
    return 1;
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf1,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Str_MuxFindPath_rec( Str_Mux_t * pMux, int * pPath, int * pnLength )
{
    int i, DelayMax = Abc_MaxInt( pMux->Edge[0].FanDel, Abc_MaxInt(pMux->Edge[1].FanDel, pMux->Edge[2].FanDel) );
    for ( i = 0; i < 2; i++ )
        if ( pMux->Edge[i].FanDel == DelayMax )
            return Str_MuxFindPathEdge_rec( pMux, i, pPath, pnLength );
    if ( pMux->Edge[2].FanDel == DelayMax )
        return 0;
    assert( 0 );
    return -1;
}